

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiWindow * FindWindowNavigable(int i_start,int i_stop,int dir)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  
  if (-1 < i_start) {
    iVar1 = (GImGui->Windows).Size;
    do {
      if (i_stop == i_start) {
        return (ImGuiWindow *)0x0;
      }
      if (iVar1 <= i_start) {
        return (ImGuiWindow *)0x0;
      }
      pIVar2 = (GImGui->Windows).Data[(uint)i_start];
      if (((pIVar2->Active == true) && (pIVar2->RootWindowForTabbing == pIVar2)) &&
         (((pIVar2->Flags & 0x80000) == 0 || (GImGui->NavWindow == pIVar2)))) {
        if (iVar1 <= i_start) {
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                        ,0x4c0,
                        "value_type &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
        }
        return pIVar2;
      }
      i_start = i_start + dir;
    } while (-1 < i_start);
  }
  return (ImGuiWindow *)0x0;
}

Assistant:

static ImGuiWindow* FindWindowNavigable(int i_start, int i_stop, int dir) // FIXME-OPT O(N)
{
    ImGuiContext& g = *GImGui;
    for (int i = i_start; i >= 0 && i < g.Windows.Size && i != i_stop; i += dir)
        if (ImGui::IsWindowNavFocusable(g.Windows[i]))
            return g.Windows[i];
    return NULL;
}